

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

void __thiscall XMISong::XMISong(XMISong *this,XMISong *original,char *filename,EMidiDevice type)

{
  int iVar1;
  undefined1 auVar2 [16];
  BYTE *pBVar3;
  ulong uVar4;
  TrackInfo *pTVar5;
  TrackInfo *pTVar6;
  TrackInfo *oldtrack;
  TrackInfo *newtrack;
  int i;
  EMidiDevice type_local;
  char *filename_local;
  XMISong *original_local;
  XMISong *this_local;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__XMISong_009f0788;
  NoteOffQueue::NoteOffQueue(&this->NoteOffs);
  this->SongLen = original->SongLen;
  pBVar3 = (BYTE *)operator_new__((long)original->SongLen);
  this->MusHeader = pBVar3;
  memcpy(this->MusHeader,original->MusHeader,(long)original->SongLen);
  this->NumSongs = original->NumSongs;
  iVar1 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar1;
  (this->super_MIDIStreamer).Tempo = iVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->NumSongs;
  uVar4 = SUB168(auVar2 * ZEXT816(0x80),0);
  if (SUB168(auVar2 * ZEXT816(0x80),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pTVar5 = (TrackInfo *)operator_new__(uVar4);
  this->Songs = pTVar5;
  for (newtrack._0_4_ = 0; (int)newtrack < this->NumSongs; newtrack._0_4_ = (int)newtrack + 1) {
    pTVar5 = this->Songs + (int)newtrack;
    pTVar6 = original->Songs + (int)newtrack;
    pTVar5->EventChunk = this->MusHeader + ((long)pTVar6->EventChunk - (long)original->MusHeader);
    pTVar5->EventLen = pTVar6->EventLen;
    pTVar5->EventP = 0;
    pTVar5->TimbreChunk = this->MusHeader + ((long)pTVar6->TimbreChunk - (long)original->MusHeader);
    pTVar5->TimbreLen = pTVar6->TimbreLen;
  }
  return;
}

Assistant:

XMISong::XMISong(const XMISong *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	NumSongs = original->NumSongs;
	Tempo = InitialTempo = original->InitialTempo;
	Songs = new TrackInfo[NumSongs];
	for (int i = 0; i < NumSongs; ++i)
	{
		TrackInfo *newtrack = &Songs[i];
		const TrackInfo *oldtrack = &original->Songs[i];

		newtrack->EventChunk = MusHeader + (oldtrack->EventChunk - original->MusHeader);
		newtrack->EventLen = oldtrack->EventLen;
		newtrack->EventP = 0;

		newtrack->TimbreChunk = MusHeader + (oldtrack->TimbreChunk - original->MusHeader);
		newtrack->TimbreLen = oldtrack->TimbreLen;
	}
}